

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

char * __thiscall DynamicProfileStorage::StorageInfo::ReadRecord(StorageInfo *this)

{
  bool bVar1;
  DWORD bufferSize;
  char *t;
  char *record;
  int32 size;
  undefined1 local_240 [8];
  DynamicProfileStorageReaderWriter reader;
  char16 cacheFilename [260];
  StorageInfo *this_local;
  
  GetFilename(this,(char16 *)&reader.deleteNonClosed);
  DynamicProfileStorageReaderWriter::DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)local_240);
  bVar1 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)local_240,
                     (char16 *)&reader.deleteNonClosed,L"rb",false,(errno_t *)0x0);
  if (bVar1) {
    bufferSize = DynamicProfileStorageReaderWriter::Size
                           ((DynamicProfileStorageReaderWriter *)local_240);
    this_local = (StorageInfo *)AllocRecord(bufferSize);
    if (this_local == (StorageInfo *)0x0) {
      Output::Print(L"ERROR: DynamicProfileStorage: Out of memory reading \'%s\'",
                    &reader.deleteNonClosed);
      Output::Flush();
      this_local = (StorageInfo *)0x0;
    }
    else {
      t = GetRecordBuffer((char *)this_local);
      bVar1 = DynamicProfileStorageReaderWriter::ReadArray<char>
                        ((DynamicProfileStorageReaderWriter *)local_240,t,(long)(int)bufferSize);
      if (!bVar1) {
        DeleteRecord((char *)this_local);
        this_local = (StorageInfo *)0x0;
      }
    }
  }
  else {
    bVar1 = DoTrace();
    if (bVar1) {
      Output::Print(L"TRACE: DynamicProfileStorage: Unable to open cache dir file \'%s\'",
                    &reader.deleteNonClosed);
      Output::Flush();
    }
    this_local = (StorageInfo *)0x0;
  }
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)local_240);
  return &this_local->isFileStorage;
}

Assistant:

char const * DynamicProfileStorage::StorageInfo::ReadRecord() const
{
    char16 cacheFilename[_MAX_PATH];
    this->GetFilename(cacheFilename);
    DynamicProfileStorageReaderWriter reader;
    if (!reader.Init(cacheFilename, _u("rb"), false))
    {
#if DBG_DUMP
        if (DynamicProfileStorage::DoTrace())
        {
            Output::Print(_u("TRACE: DynamicProfileStorage: Unable to open cache dir file '%s'"), cacheFilename);
            Output::Flush();
        }
#endif
        return nullptr;
    }

    int32 size = reader.Size();
    char * record = AllocRecord(size);
    if (record == nullptr)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Out of memory reading '%s'"), cacheFilename);
        Output::Flush();
        return nullptr;
    }

    if (!reader.ReadArray(GetRecordBuffer(record), size))
    {
        DeleteRecord(record);
        return nullptr;
    }
    return record;
}